

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

uint16_t prune_txk_type(AV1_COMP *cpi,MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,int blk_row,
                       int blk_col,BLOCK_SIZE plane_bsize,int *txk_map,uint16_t allowed_tx_mask,
                       int prune_factor,TXB_CTX *txb_ctx,int reduced_tx_set_used)

{
  long in_RSI;
  int idx_1;
  int64_t factor;
  ushort in_stack_00000020;
  uint16_t prune;
  SCAN_ORDER *scan_order;
  int64_t sse;
  int64_t dist;
  int rate_cost;
  int idx;
  QUANT_PARAM quant_param;
  TxfmParam txfm_param;
  int last;
  int num_cand;
  int64_t rds [16];
  int tx_type;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  QUANT_PARAM *in_stack_fffffffffffffea8;
  undefined1 *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  int iVar1;
  MACROBLOCK *in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffec8;
  undefined2 in_stack_fffffffffffffece;
  AV1_COMMON *in_stack_fffffffffffffed0;
  QUANT_PARAM *qparam;
  long local_120;
  int local_118;
  int local_114;
  int16_t *in_stack_fffffffffffffef0;
  qm_val_t *in_stack_fffffffffffffef8;
  TX_SIZE in_stack_ffffffffffffff07;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  undefined6 in_stack_ffffffffffffff10;
  TX_TYPE in_stack_ffffffffffffff16;
  TX_SIZE in_stack_ffffffffffffff17;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  MACROBLOCK *in_stack_ffffffffffffff20;
  int64_t *in_stack_ffffffffffffff28;
  int local_d0;
  int local_cc;
  long local_c8 [13];
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  uint16_t local_2;
  
  local_cc = 0;
  local_d0 = 0xf;
  av1_setup_xform(in_stack_fffffffffffffed0,
                  (MACROBLOCK *)CONCAT26(in_stack_fffffffffffffece,in_stack_fffffffffffffec8),
                  (TX_SIZE)((ulong)in_stack_fffffffffffffec0 >> 0x38),
                  (TX_TYPE)((ulong)in_stack_fffffffffffffec0 >> 0x30),
                  (TxfmParam *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  av1_setup_quant((TX_SIZE)((ulong)in_stack_fffffffffffffeb0 >> 0x38),(int)in_stack_fffffffffffffeb0
                  ,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8,
                  (QUANT_PARAM *)0x326d9f);
  for (local_114 = 0; iVar1 = local_114, local_114 < 0x10; local_114 = local_114 + 1) {
    local_118 = 0;
    local_120 = 0;
    qparam = (QUANT_PARAM *)0x0;
    if (((uint)in_stack_00000020 & 1 << ((byte)local_114 & 0x1f)) == 0) {
      *(int *)(factor + (long)local_d0 * 4) = local_114;
      local_d0 = local_d0 + -1;
    }
    else {
      in_stack_ffffffffffffff18 =
           CONCAT31((int3)((uint)in_stack_ffffffffffffff18 >> 8),(byte)local_114);
      av1_setup_qmatrix((CommonQuantParams *)in_stack_fffffffffffffec0,
                        (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                        ,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                        (TX_SIZE)((ulong)in_stack_fffffffffffffeb0 >> 0x18),
                        (TX_TYPE)((ulong)in_stack_fffffffffffffeb0 >> 0x10),
                        in_stack_fffffffffffffea8);
      av1_xform_quant(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
                      (int)((ulong)&stack0xfffffffffffffef0 >> 0x20),(int)&stack0xfffffffffffffef0,
                      (BLOCK_SIZE)((ulong)&stack0xffffffffffffff18 >> 0x38),
                      (TxfmParam *)in_stack_fffffffffffffed0,qparam);
      local_118 = av1_cost_coeffs_txb_laplacian
                            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                             in_stack_ffffffffffffff18,in_stack_ffffffffffffff17,
                             in_stack_ffffffffffffff16,
                             (TXB_CTX *)
                             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                             in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8);
      in_stack_fffffffffffffed0 = (AV1_COMMON *)get_scan('\0','\0');
      in_stack_fffffffffffffea8 = (QUANT_PARAM *)&local_120;
      in_stack_fffffffffffffeb0 = &stack0xfffffffffffffed8;
      dist_block_tx_domain
                ((MACROBLOCK *)
                 CONCAT17(in_stack_ffffffffffffff17,
                          CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                 in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,in_stack_ffffffffffffff07,
                 in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 (int64_t *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
      *(int *)(factor + (long)local_cc * 4) = iVar1;
      local_c8[local_cc] =
           ((long)local_118 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) + local_120 * 0x80;
      if (local_c8[local_cc] == 0) {
        local_c8[local_cc] = 1;
      }
      local_cc = local_cc + 1;
    }
  }
  if (local_cc == 0) {
    local_2 = 0xffff;
  }
  else {
    sort_rd(local_c8,(int *)factor,local_cc);
    local_2 = (ushort)(1 << ((byte)*(undefined4 *)factor & 0x1f)) ^ 0xffff;
    iVar1 = 1;
    while ((iVar1 < local_cc &&
           (((local_c8[iVar1] - local_c8[0]) * 1000) / local_c8[0] < (long)(int)scan_order))) {
      local_2 = local_2 & ((ushort)(1 << ((byte)*(undefined4 *)(factor + (long)iVar1 * 4) & 0x1f)) ^
                          0xffff);
      iVar1 = iVar1 + 1;
    }
  }
  return local_2;
}

Assistant:

static uint16_t prune_txk_type(const AV1_COMP *cpi, MACROBLOCK *x, int plane,
                               int block, TX_SIZE tx_size, int blk_row,
                               int blk_col, BLOCK_SIZE plane_bsize,
                               int *txk_map, uint16_t allowed_tx_mask,
                               int prune_factor, const TXB_CTX *const txb_ctx,
                               int reduced_tx_set_used) {
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  int tx_type;

  int64_t rds[TX_TYPES];

  int num_cand = 0;
  int last = TX_TYPES - 1;

  TxfmParam txfm_param;
  QUANT_PARAM quant_param;
  av1_setup_xform(cm, x, tx_size, DCT_DCT, &txfm_param);
  av1_setup_quant(tx_size, 1, AV1_XFORM_QUANT_B, cpi->oxcf.q_cfg.quant_b_adapt,
                  &quant_param);

  for (int idx = 0; idx < TX_TYPES; idx++) {
    tx_type = idx;
    int rate_cost = 0;
    int64_t dist = 0, sse = 0;
    if (!(allowed_tx_mask & (1 << tx_type))) {
      txk_map[last] = tx_type;
      last--;
      continue;
    }
    txfm_param.tx_type = tx_type;

    av1_setup_qmatrix(&cm->quant_params, xd, plane, tx_size, tx_type,
                      &quant_param);

    // do txfm and quantization
    av1_xform_quant(x, plane, block, blk_row, blk_col, plane_bsize, &txfm_param,
                    &quant_param);
    // estimate rate cost
    rate_cost = av1_cost_coeffs_txb_laplacian(x, plane, block, tx_size, tx_type,
                                              txb_ctx, reduced_tx_set_used, 0);
    // tx domain dist
    const SCAN_ORDER *const scan_order =
        get_scan(txfm_param.tx_size, txfm_param.tx_type);
    dist_block_tx_domain(x, plane, block, tx_size, quant_param.qmatrix,
                         scan_order->scan, &dist, &sse);

    txk_map[num_cand] = tx_type;
    rds[num_cand] = RDCOST(x->rdmult, rate_cost, dist);
    if (rds[num_cand] == 0) rds[num_cand] = 1;
    num_cand++;
  }

  if (num_cand == 0) return (uint16_t)0xFFFF;

  sort_rd(rds, txk_map, num_cand);
  uint16_t prune = (uint16_t)(~(1 << txk_map[0]));

  // 0 < prune_factor <= 1000 controls aggressiveness
  int64_t factor = 0;
  for (int idx = 1; idx < num_cand; idx++) {
    factor = 1000 * (rds[idx] - rds[0]) / rds[0];
    if (factor < (int64_t)prune_factor)
      prune &= ~(1 << txk_map[idx]);
    else
      break;
  }
  return prune;
}